

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodePairLdStInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  bool bVar1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t RegNo_01;
  uint32_t uVar2;
  uint uVar3;
  _Bool NeedsDisjointWritebackTransfer;
  uint Opcode;
  _Bool IsLoad;
  int32_t offset;
  uint Rt2;
  uint Rn;
  uint Rt;
  void *Decoder_local;
  uint64_t Addr_local;
  uint32_t insn_local;
  MCInst *Inst_local;
  
  RegNo = fieldFromInstruction(insn,0,5);
  RegNo_00 = fieldFromInstruction(insn,5,5);
  RegNo_01 = fieldFromInstruction(insn,10,5);
  Opcode = fieldFromInstruction(insn,0xf,7);
  uVar2 = fieldFromInstruction(insn,0x16,1);
  uVar3 = MCInst_getOpcode(Inst);
  bVar1 = false;
  if ((Opcode & 0x40) != 0) {
    Opcode = Opcode | 0xffffff80;
  }
  if (((((((uVar3 - 0x3b3 < 2) || (uVar3 - 0x3b6 < 2)) || (uVar3 - 0x3b9 < 2)) ||
        ((uVar3 - 0x3bc < 2 || (uVar3 - 0x3bf < 2)))) ||
       ((uVar3 - 0x3c2 < 2 || ((uVar3 - 0x747 < 2 || (uVar3 - 0x74a < 2)))))) || (uVar3 - 0x74d < 2)
      ) || ((uVar3 - 0x750 < 2 || (uVar3 - 0x753 < 2)))) {
    DecodeGPR64spRegisterClass(Inst,RegNo_00,Addr,Decoder);
  }
  if (uVar3 == 0x3ad) {
LAB_001a4c47:
    DecodeFPR64RegisterClass(Inst,RegNo,Addr,Decoder);
    DecodeFPR64RegisterClass(Inst,RegNo_01,Addr,Decoder);
    goto LAB_001a4c99;
  }
  if (uVar3 == 0x3ae) {
LAB_001a4c1d:
    DecodeFPR128RegisterClass(Inst,RegNo,Addr,Decoder);
    DecodeFPR128RegisterClass(Inst,RegNo_01,Addr,Decoder);
    goto LAB_001a4c99;
  }
  if (uVar3 == 0x3af) goto LAB_001a4c71;
  if (uVar3 == 0x3b0) goto LAB_001a4bf3;
  if (uVar3 != 0x3b1) {
    if (uVar3 - 0x3b2 < 3) goto LAB_001a4c47;
    if (uVar3 - 0x3b5 < 3) goto LAB_001a4c1d;
    if (uVar3 != 0x3b8) {
      if (1 < uVar3 - 0x3b9) {
        if (uVar3 - 0x3bb < 3) goto LAB_001a4c71;
        if (uVar3 != 0x3be) {
          if (1 < uVar3 - 0x3bf) {
            if (uVar3 != 0x3c1) {
              if (uVar3 - 0x3c2 < 2) goto LAB_001a4bbe;
              if (uVar3 == 0x741) goto LAB_001a4c47;
              if (uVar3 == 0x742) goto LAB_001a4c1d;
              if (uVar3 == 0x743) {
LAB_001a4c71:
                DecodeFPR32RegisterClass(Inst,RegNo,Addr,Decoder);
                DecodeFPR32RegisterClass(Inst,RegNo_01,Addr,Decoder);
                goto LAB_001a4c99;
              }
              if (uVar3 == 0x744) goto LAB_001a4bf3;
              if (uVar3 != 0x745) {
                if (uVar3 - 0x746 < 3) goto LAB_001a4c47;
                if (uVar3 - 0x749 < 3) goto LAB_001a4c1d;
                if (uVar3 - 0x74c < 3) goto LAB_001a4c71;
                if (uVar3 == 0x74f) goto LAB_001a4bf3;
                if (uVar3 - 0x750 < 2) goto LAB_001a4bef;
                if (uVar3 != 0x752) {
                  if (1 < uVar3 - 0x753) {
                    return MCDisassembler_Fail;
                  }
                  goto LAB_001a4bbe;
                }
              }
            }
            goto LAB_001a4bc2;
          }
LAB_001a4bef:
          bVar1 = true;
        }
LAB_001a4bf3:
        DecodeGPR32RegisterClass(Inst,RegNo,Addr,Decoder);
        DecodeGPR32RegisterClass(Inst,RegNo_01,Addr,Decoder);
        goto LAB_001a4c99;
      }
LAB_001a4bbe:
      bVar1 = true;
    }
  }
LAB_001a4bc2:
  DecodeGPR64RegisterClass(Inst,RegNo,Addr,Decoder);
  DecodeGPR64RegisterClass(Inst,RegNo_01,Addr,Decoder);
LAB_001a4c99:
  DecodeGPR64spRegisterClass(Inst,RegNo_00,Addr,Decoder);
  MCOperand_CreateImm0(Inst,(long)(int)Opcode);
  if ((uVar2 == 0) || (RegNo != RegNo_01)) {
    if (((bVar1) && (RegNo_00 != 0x1f)) && ((RegNo == RegNo_00 || (RegNo_01 == RegNo_00)))) {
      Inst_local._4_4_ = MCDisassembler_SoftFail;
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Success;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_SoftFail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodePairLdStInstruction(MCInst *Inst, uint32_t insn,
		uint64_t Addr,
		void *Decoder)
{
	unsigned Rt = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Rt2 = fieldFromInstruction(insn, 10, 5);
	int32_t offset = fieldFromInstruction(insn, 15, 7);
	bool IsLoad = fieldFromInstruction(insn, 22, 1);
	unsigned Opcode = MCInst_getOpcode(Inst);
	bool NeedsDisjointWritebackTransfer = false;

	// offset is a 7-bit signed immediate, so sign extend it to
	// fill the unsigned.
	if (offset & (1 << (7 - 1)))
		offset |= ~((1LL << 7) - 1);

	// First operand is always writeback of base register.
	switch (Opcode) {
		default:
			break;
		case AArch64_LDPXpost:
		case AArch64_STPXpost:
		case AArch64_LDPSWpost:
		case AArch64_LDPXpre:
		case AArch64_STPXpre:
		case AArch64_LDPSWpre:
		case AArch64_LDPWpost:
		case AArch64_STPWpost:
		case AArch64_LDPWpre:
		case AArch64_STPWpre:
		case AArch64_LDPQpost:
		case AArch64_STPQpost:
		case AArch64_LDPQpre:
		case AArch64_STPQpre:
		case AArch64_LDPDpost:
		case AArch64_STPDpost:
		case AArch64_LDPDpre:
		case AArch64_STPDpre:
		case AArch64_LDPSpost:
		case AArch64_STPSpost:
		case AArch64_LDPSpre:
		case AArch64_STPSpre:
			DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
			break;
	}

	switch (Opcode) {
		default:
			return Fail;
		case AArch64_LDPXpost:
		case AArch64_STPXpost:
		case AArch64_LDPSWpost:
		case AArch64_LDPXpre:
		case AArch64_STPXpre:
		case AArch64_LDPSWpre:
			NeedsDisjointWritebackTransfer = true;
			// Fallthrough
		case AArch64_LDNPXi:
		case AArch64_STNPXi:
		case AArch64_LDPXi:
		case AArch64_STPXi:
		case AArch64_LDPSWi:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeGPR64RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_LDPWpost:
		case AArch64_STPWpost:
		case AArch64_LDPWpre:
		case AArch64_STPWpre:
			NeedsDisjointWritebackTransfer = true;
			// Fallthrough
		case AArch64_LDNPWi:
		case AArch64_STNPWi:
		case AArch64_LDPWi:
		case AArch64_STPWi:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeGPR32RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_LDNPQi:
		case AArch64_STNPQi:
		case AArch64_LDPQpost:
		case AArch64_STPQpost:
		case AArch64_LDPQi:
		case AArch64_STPQi:
		case AArch64_LDPQpre:
		case AArch64_STPQpre:
			DecodeFPR128RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeFPR128RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_LDNPDi:
		case AArch64_STNPDi:
		case AArch64_LDPDpost:
		case AArch64_STPDpost:
		case AArch64_LDPDi:
		case AArch64_STPDi:
		case AArch64_LDPDpre:
		case AArch64_STPDpre:
			DecodeFPR64RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeFPR64RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_LDNPSi:
		case AArch64_STNPSi:
		case AArch64_LDPSpost:
		case AArch64_STPSpost:
		case AArch64_LDPSi:
		case AArch64_STPSi:
		case AArch64_LDPSpre:
		case AArch64_STPSpre:
			DecodeFPR32RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeFPR32RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
	}

	DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
	MCOperand_CreateImm0(Inst, offset);

	// You shouldn't load to the same register twice in an instruction...
	if (IsLoad && Rt == Rt2)
		return SoftFail;

	// ... or do any operation that writes-back to a transfer register. But note
	// that "stp xzr, xzr, [sp], #4" is fine because xzr and sp are different.
	if (NeedsDisjointWritebackTransfer && Rn != 31 && (Rt == Rn || Rt2 == Rn))
		return SoftFail;

	return Success;
}